

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O3

void RunThread(_func_void *fn)

{
  _func_void *local_20;
  _func_void *fn_local;
  
  local_20 = fn;
  std::thread::thread<void(*&)(),,void>((thread *)&fn_local,&local_20);
  std::thread::join();
  if (fn_local == (_func_void *)0x0) {
    return;
  }
  std::terminate();
}

Assistant:

void RunThread(void (*fn)()) {
    std::thread{fn}.join();
  }